

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

void __thiscall
iutest::detail::
PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>::
~PropertyMatcher(PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>
                 *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

class PropertyMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PropertyMatcher(const F& prop, const T& expected) : m_property(prop), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Property: " << m_expected;
        //strm << "Property: (" << detail::GetTypeNameProxy<F>::GetTypeName() << ") " << m_expected;
        return strm.str();
    }